

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.h
# Opt level: O2

void __thiscall dlib::text_field::text_field(text_field *this,drawable_window *w)

{
  popup_menu_region *this_00;
  text_field_style *ptVar1;
  int iVar2;
  int iVar3;
  text_field_style *ptVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  popup_menu *ppVar5;
  allocator local_c1 [9];
  string local_b8;
  menu_item_text local_98;
  
  drawable::drawable(&this->super_drawable,w,0x93);
  (this->super_drawable)._vptr_drawable = (_func_int **)&PTR__text_field_00336c90;
  (this->text_)._M_dataplus._M_p = (pointer)&(this->text_).field_2;
  (this->text_)._M_string_length = 0;
  (this->text_).field_2._M_local_buf[0] = 0;
  (this->text_color_).red = '\0';
  (this->text_color_).green = '\0';
  (this->text_color_).blue = '\0';
  (this->bg_color_).red = 0xff;
  (this->bg_color_).green = 0xff;
  (this->bg_color_).blue = 0xff;
  this->cursor_pos = 0;
  this->highlight_start = 0;
  this->text_width = 0;
  this->text_pos = 0;
  *(undefined4 *)((long)&this->text_pos + 7) = 0;
  *(undefined4 *)&this->highlight_end = 0xffffffff;
  *(undefined4 *)((long)&this->highlight_end + 4) = 0xffffffff;
  *(undefined4 *)&this->shift_pos = 0xffffffff;
  *(undefined4 *)((long)&this->shift_pos + 4) = 0xffffffff;
  (this->text_modified_handler).data._M_t.
  super___uniq_ptr_impl<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
  .super__Head_base<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_false>.
  _M_head_impl = (Tbase<void_()> *)0x0;
  (this->enter_key_handler).data._M_t.
  super___uniq_ptr_impl<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
  .super__Head_base<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_false>.
  _M_head_impl = (Tbase<void_()> *)0x0;
  (this->focus_lost_handler).data._M_t.
  super___uniq_ptr_impl<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
  .super__Head_base<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_false>.
  _M_head_impl = (Tbase<void_()> *)0x0;
  (this->style)._M_t.
  super___uniq_ptr_impl<dlib::text_field_style,_std::default_delete<dlib::text_field_style>_>._M_t.
  super__Tuple_impl<0UL,_dlib::text_field_style_*,_std::default_delete<dlib::text_field_style>_>.
  super__Head_base<0UL,_dlib::text_field_style_*,_false>._M_head_impl = (text_field_style *)0x0;
  timer<dlib::text_field>::timer(&this->t,this,(af_type)timer_action);
  this_00 = &this->right_click_menu;
  popup_menu_region::popup_menu_region(this_00,w);
  ptVar4 = (text_field_style *)operator_new(8);
  ptVar4->_vptr_text_field_style = (_func_int **)&PTR__text_field_style_00339548;
  ptVar1 = (this->style)._M_t.
           super___uniq_ptr_impl<dlib::text_field_style,_std::default_delete<dlib::text_field_style>_>
           ._M_t.
           super__Tuple_impl<0UL,_dlib::text_field_style_*,_std::default_delete<dlib::text_field_style>_>
           .super__Head_base<0UL,_dlib::text_field_style_*,_false>._M_head_impl;
  (this->style)._M_t.
  super___uniq_ptr_impl<dlib::text_field_style,_std::default_delete<dlib::text_field_style>_>._M_t.
  super__Tuple_impl<0UL,_dlib::text_field_style_*,_std::default_delete<dlib::text_field_style>_>.
  super__Head_base<0UL,_dlib::text_field_style_*,_false>._M_head_impl = ptVar4;
  if (ptVar1 != (text_field_style *)0x0) {
    (*ptVar1->_vptr_text_field_style[1])();
  }
  iVar2 = (*((this->super_drawable).mfont.super___shared_ptr<dlib::font,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->_vptr_font[4])();
  ptVar1 = (this->style)._M_t.
           super___uniq_ptr_impl<dlib::text_field_style,_std::default_delete<dlib::text_field_style>_>
           ._M_t.
           super__Tuple_impl<0UL,_dlib::text_field_style_*,_std::default_delete<dlib::text_field_style>_>
           .super__Head_base<0UL,_dlib::text_field_style_*,_false>._M_head_impl;
  iVar3 = (*ptVar1->_vptr_text_field_style[2])
                    (ptVar1,(this->super_drawable).mfont.
                            super___shared_ptr<dlib::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  (this->super_drawable).rect.b = CONCAT44(extraout_var_00,iVar3) * 2 + CONCAT44(extraout_var,iVar2)
  ;
  ptVar1 = (this->style)._M_t.
           super___uniq_ptr_impl<dlib::text_field_style,_std::default_delete<dlib::text_field_style>_>
           ._M_t.
           super__Tuple_impl<0UL,_dlib::text_field_style_*,_std::default_delete<dlib::text_field_style>_>
           .super__Head_base<0UL,_dlib::text_field_style_*,_false>._M_head_impl;
  iVar2 = (*ptVar1->_vptr_text_field_style[2])
                    (ptVar1,(this->super_drawable).mfont.
                            super___shared_ptr<dlib::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  (this->super_drawable).rect.r = CONCAT44(extraout_var_01,iVar2) * 2;
  ptVar1 = (this->style)._M_t.
           super___uniq_ptr_impl<dlib::text_field_style,_std::default_delete<dlib::text_field_style>_>
           ._M_t.
           super__Tuple_impl<0UL,_dlib::text_field_style_*,_std::default_delete<dlib::text_field_style>_>
           .super__Head_base<0UL,_dlib::text_field_style_*,_false>._M_head_impl;
  iVar2 = (*ptVar1->_vptr_text_field_style[2])
                    (ptVar1,(this->super_drawable).mfont.
                            super___shared_ptr<dlib::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  this->cursor_x = CONCAT44(extraout_var_02,iVar2);
  ppVar5 = popup_menu_region::menu(this_00);
  std::__cxx11::string::string((string *)&local_b8,"Cut",local_c1);
  menu_item_text::menu_item_text<dlib::text_field>
            (&local_98,&local_b8,this,(offset_in_text_field_to_subr)on_cut,0);
  popup_menu::add_menu_item<dlib::menu_item_text>(ppVar5,&local_98);
  menu_item_text::~menu_item_text(&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  ppVar5 = popup_menu_region::menu(this_00);
  std::__cxx11::string::string((string *)&local_b8,"Copy",local_c1);
  menu_item_text::menu_item_text<dlib::text_field>
            (&local_98,&local_b8,this,(offset_in_text_field_to_subr)on_copy,0);
  popup_menu::add_menu_item<dlib::menu_item_text>(ppVar5,&local_98);
  menu_item_text::~menu_item_text(&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  ppVar5 = popup_menu_region::menu(this_00);
  std::__cxx11::string::string((string *)&local_b8,"Paste",local_c1);
  menu_item_text::menu_item_text<dlib::text_field>
            (&local_98,&local_b8,this,(offset_in_text_field_to_subr)on_paste,0);
  popup_menu::add_menu_item<dlib::menu_item_text>(ppVar5,&local_98);
  menu_item_text::~menu_item_text(&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  ppVar5 = popup_menu_region::menu(this_00);
  std::__cxx11::string::string((string *)&local_b8,"Delete",local_c1);
  menu_item_text::menu_item_text<dlib::text_field>
            (&local_98,&local_b8,this,(offset_in_text_field_to_subr)on_delete_selected,0);
  popup_menu::add_menu_item<dlib::menu_item_text>(ppVar5,&local_98);
  menu_item_text::~menu_item_text(&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  ppVar5 = popup_menu_region::menu(this_00);
  local_98.super_menu_item._vptr_menu_item = (_func_int **)&PTR__menu_item_00337b08;
  popup_menu::add_menu_item<dlib::menu_item_separator>(ppVar5,(menu_item_separator *)&local_98);
  ppVar5 = popup_menu_region::menu(this_00);
  std::__cxx11::string::string((string *)&local_b8,"Select All",local_c1);
  menu_item_text::menu_item_text<dlib::text_field>
            (&local_98,&local_b8,this,(offset_in_text_field_to_subr)on_select_all,0);
  popup_menu::add_menu_item<dlib::menu_item_text>(ppVar5,&local_98);
  menu_item_text::~menu_item_text(&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  get_text_rect((rectangle *)&local_98,this);
  popup_menu_region::set_rect(this_00,(rectangle *)&local_98);
  drawable::enable_events(&this->super_drawable);
  timer<dlib::text_field>::set_delay_time(&this->t,500);
  return;
}

Assistant:

text_field(
            drawable_window& w
        ) : 
            drawable(w,MOUSE_CLICK | KEYBOARD_EVENTS | MOUSE_MOVE | STRING_PUT),
            text_color_(0,0,0),
            bg_color_(255,255,255),
            text_width(0),
            text_pos(0),
            recent_movement(false),
            has_focus(false),
            cursor_visible(false),
            cursor_pos(0),
            highlight_start(0),
            highlight_end(-1),
            shift_pos(-1),
            t(*this,&text_field::timer_action),
            right_click_menu(w)
        {
            style.reset(new text_field_style_default());
            rect.set_bottom(mfont->height()+ (style->get_padding(*mfont))*2);
            rect.set_right((style->get_padding(*mfont))*2);
            cursor_x = style->get_padding(*mfont);

            right_click_menu.menu().add_menu_item(menu_item_text("Cut",*this,&text_field::on_cut,'t'));
            right_click_menu.menu().add_menu_item(menu_item_text("Copy",*this,&text_field::on_copy,'C'));
            right_click_menu.menu().add_menu_item(menu_item_text("Paste",*this,&text_field::on_paste,'P'));
            right_click_menu.menu().add_menu_item(menu_item_text("Delete",*this,&text_field::on_delete_selected,'D'));
            right_click_menu.menu().add_menu_item(menu_item_separator());
            right_click_menu.menu().add_menu_item(menu_item_text("Select All",*this,&text_field::on_select_all,'A'));

            right_click_menu.set_rect(get_text_rect());
            enable_events();

            t.set_delay_time(500);
        }